

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootchart.c
# Opt level: O0

void do_log_uptime(FileBuff log)

{
  int fd_00;
  int iVar1;
  FileBuff buff_00;
  size_t sVar2;
  double dVar3;
  int len_1;
  longlong jiffies;
  int ret_1;
  int len;
  int ret;
  int fd;
  char buff [65];
  undefined4 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  char local_58 [64];
  undefined1 local_18;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  fd_00 = open("/proc/uptime",0);
  if (-1 < fd_00) {
    iVar1 = unix_read(fd_00,(void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      iVar1);
    close(fd_00);
    local_18 = 0;
    if (-1 < iVar1) {
      dVar3 = strtod(local_58,(char **)0x0);
      buff_00 = (FileBuff)(long)(dVar3 * 100.0);
      snprintf(local_58,0x41,"%lld\n",buff_00);
      sVar2 = strlen(local_58);
      file_buff_write(buff_00,(void *)CONCAT44((int)sVar2,in_stack_ffffffffffffff88),0);
    }
  }
  return;
}

Assistant:

static void
do_log_uptime(FileBuff  log)
{
    char  buff[65];
    int   fd, ret, len;

    fd = open("/proc/uptime",O_RDONLY);
    if (fd >= 0) {
        int  ret;
        ret = unix_read(fd, buff, 64);
        close(fd);
        buff[64] = 0;
        if (ret >= 0) {
            long long  jiffies = 100LL*strtod(buff,NULL);
            int        len;
            snprintf(buff,sizeof(buff),"%lld\n",jiffies);
            len = strlen(buff);
            file_buff_write(log, buff, len);
        }
    }
}